

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_wait_children_dep.cpp
# Opt level: O1

void g(int *i)

{
  spin_mutex_t sVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"g begin: ",9);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with i=",8);
  plVar4 = (long *)std::ostream::operator<<(poVar3,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  *i = *i + 1;
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"g finish: ",10);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with i=",8);
  plVar4 = (long *)std::ostream::operator<<(poVar3,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void g(int &i) {  
  LOG("g begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
  
  i++;
  
  LOG("g finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}